

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O2

ggml_backend_reg_t __thiscall
ggml_backend_registry::load_backend(ggml_backend_registry *this,path *path,bool silent)

{
  int iVar1;
  _Head_base<0UL,_void_*,_false> _Var2;
  code *pcVar3;
  ggml_backend_reg_t reg;
  undefined8 uVar4;
  string local_58;
  dl_handle_ptr handle;
  dl_handle_ptr local_30;
  
  _Var2._M_head_impl = dl_load_library(path);
  handle._M_t.super___uniq_ptr_impl<void,_dl_handle_deleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.super__Head_base<0UL,_void_*,_false>.
  _M_head_impl = (__uniq_ptr_data<void,_dl_handle_deleter,_true,_true>)
                 (__uniq_ptr_data<void,_dl_handle_deleter,_true,_true>)_Var2._M_head_impl;
  if ((tuple<void_*,_dl_handle_deleter>)_Var2._M_head_impl == (_Head_base<0UL,_void_*,_false>)0x0) {
    if (!silent) {
      path_str(&local_58,path);
      ggml_log_internal(4,"%s: failed to load %s\n","load_backend",local_58._M_dataplus._M_p);
LAB_00107b74:
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  else {
    pcVar3 = (code *)dlsym(_Var2._M_head_impl,"ggml_backend_score");
    if ((pcVar3 == (code *)0x0) ||
       (iVar1 = (*pcVar3)(), _Var2._M_head_impl = (void *)handle, iVar1 != 0)) {
      pcVar3 = (code *)dlsym(_Var2._M_head_impl,"ggml_backend_init");
      if (pcVar3 == (code *)0x0) {
        if (!silent) {
          path_str(&local_58,path);
          ggml_log_internal(4,"%s: failed to find ggml_backend_init in %s\n","load_backend",
                            local_58._M_dataplus._M_p);
          goto LAB_00107b74;
        }
      }
      else {
        reg = (ggml_backend_reg_t)(*pcVar3)();
        if (reg == (ggml_backend_reg_t)0x0) {
          if (!silent) {
            path_str(&local_58,path);
            ggml_log_internal(4,
                              "%s: failed to initialize backend from %s: ggml_backend_init returned NULL\n"
                              ,"load_backend",local_58._M_dataplus._M_p);
            goto LAB_00107b74;
          }
        }
        else {
          if (reg->api_version == 1) {
            uVar4 = ggml_backend_reg_name(reg);
            path_str(&local_58,path);
            ggml_log_internal(2,"%s: loaded %s backend from %s\n","load_backend",uVar4,
                              local_58._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_58);
            local_30 = (dl_handle_ptr)
                       (dl_handle_ptr)
                       handle._M_t.super___uniq_ptr_impl<void,_dl_handle_deleter>._M_t.
                       super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.
                       super__Head_base<0UL,_void_*,_false>._M_head_impl;
            handle._M_t.super___uniq_ptr_impl<void,_dl_handle_deleter>._M_t.
            super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.super__Head_base<0UL,_void_*,_false>.
            _M_head_impl = (__uniq_ptr_data<void,_dl_handle_deleter,_true,_true>)
                           (__uniq_ptr_impl<void,_dl_handle_deleter>)0x0;
            register_backend(this,reg,&local_30);
            std::unique_ptr<void,_dl_handle_deleter>::~unique_ptr(&local_30);
            goto LAB_00107b7e;
          }
          if (!silent) {
            path_str(&local_58,path);
            ggml_log_internal(4,
                              "%s: failed to initialize backend from %s: incompatible API version (backend: %d, current: %d)\n"
                              ,"load_backend",local_58._M_dataplus._M_p,reg->api_version,1);
            goto LAB_00107b74;
          }
        }
      }
    }
    else if (!silent) {
      path_str(&local_58,path);
      ggml_log_internal(2,"%s: backend %s is not supported on this system\n","load_backend",
                        local_58._M_dataplus._M_p);
      goto LAB_00107b74;
    }
  }
  reg = (ggml_backend_reg_t)0x0;
LAB_00107b7e:
  std::unique_ptr<void,_dl_handle_deleter>::~unique_ptr(&handle);
  return reg;
}

Assistant:

ggml_backend_reg_t load_backend(const fs::path & path, bool silent) {
        dl_handle_ptr handle { dl_load_library(path) };
        if (!handle) {
            if (!silent) {
                GGML_LOG_ERROR("%s: failed to load %s\n", __func__, path_str(path).c_str());
            }
            return nullptr;
        }

        auto score_fn = (ggml_backend_score_t) dl_get_sym(handle.get(), "ggml_backend_score");
        if (score_fn && score_fn() == 0) {
            if (!silent) {
                GGML_LOG_INFO("%s: backend %s is not supported on this system\n", __func__, path_str(path).c_str());
            }
            return nullptr;
        }

        auto backend_init_fn = (ggml_backend_init_t) dl_get_sym(handle.get(), "ggml_backend_init");
        if (!backend_init_fn) {
            if (!silent) {
                GGML_LOG_ERROR("%s: failed to find ggml_backend_init in %s\n", __func__, path_str(path).c_str());
            }
            return nullptr;
        }

        ggml_backend_reg_t reg = backend_init_fn();
        if (!reg || reg->api_version != GGML_BACKEND_API_VERSION) {
            if (!silent) {
                if (!reg) {
                    GGML_LOG_ERROR("%s: failed to initialize backend from %s: ggml_backend_init returned NULL\n",
                        __func__, path_str(path).c_str());
                } else {
                    GGML_LOG_ERROR("%s: failed to initialize backend from %s: incompatible API version (backend: %d, current: %d)\n",
                        __func__, path_str(path).c_str(), reg->api_version, GGML_BACKEND_API_VERSION);
                }
            }
            return nullptr;
        }

        GGML_LOG_INFO("%s: loaded %s backend from %s\n", __func__, ggml_backend_reg_name(reg), path_str(path).c_str());

        register_backend(reg, std::move(handle));

        return reg;
    }